

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Matrix * MatrixRotate(Matrix *__return_storage_ptr__,Vector3 axis,float angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_34;
  float local_28;
  
  local_34 = axis.z;
  fVar5 = axis.x;
  local_28 = axis.y;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 0.0;
  __return_storage_ptr__->m2 = 0.0;
  __return_storage_ptr__->m6 = 0.0;
  __return_storage_ptr__->m10 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m1 = 0.0;
  __return_storage_ptr__->m5 = 0.0;
  __return_storage_ptr__->m9 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m0 = 0.0;
  __return_storage_ptr__->m4 = 0.0;
  __return_storage_ptr__->m8 = 0.0;
  __return_storage_ptr__->m12 = 0.0;
  fVar1 = local_34 * local_34 + fVar5 * fVar5 + local_28 * local_28;
  if ((fVar1 != 1.0) || (NAN(fVar1))) {
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      if (fVar1 < 0.0) {
        fVar1 = sqrtf(fVar1);
      }
      else {
        fVar1 = SQRT(fVar1);
      }
      fVar1 = 1.0 / fVar1;
      fVar5 = fVar5 * fVar1;
      local_28 = local_28 * fVar1;
      local_34 = local_34 * fVar1;
    }
  }
  fVar1 = sinf(angle);
  fVar2 = cosf(angle);
  fVar3 = 1.0 - fVar2;
  __return_storage_ptr__->m0 = fVar5 * fVar5 * fVar3 + fVar2;
  fVar4 = local_28 * fVar5 * fVar3;
  __return_storage_ptr__->m1 = fVar4 + local_34 * fVar1;
  fVar6 = local_34 * fVar5 * fVar3;
  __return_storage_ptr__->m2 = fVar6 - local_28 * fVar1;
  __return_storage_ptr__->m4 = fVar4 - local_34 * fVar1;
  __return_storage_ptr__->m5 = local_28 * local_28 * fVar3 + fVar2;
  fVar4 = local_34 * local_28 * fVar3;
  __return_storage_ptr__->m6 = fVar4 + fVar5 * fVar1;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m8 = fVar6 + local_28 * fVar1;
  __return_storage_ptr__->m9 = fVar4 - fVar5 * fVar1;
  __return_storage_ptr__->m10 = local_34 * local_34 * fVar3 + fVar2;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m14 = 0.0;
  __return_storage_ptr__->m3 = 0.0;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixRotate(Vector3 axis, float angle)
{
    Matrix result = { 0 };

    float x = axis.x, y = axis.y, z = axis.z;

    float lengthSquared = x*x + y*y + z*z;

    if ((lengthSquared != 1.0f) && (lengthSquared != 0.0f))
    {
        float inverseLength = 1.0f/sqrtf(lengthSquared);
        x *= inverseLength;
        y *= inverseLength;
        z *= inverseLength;
    }

    float sinres = sinf(angle);
    float cosres = cosf(angle);
    float t = 1.0f - cosres;

    result.m0  = x*x*t + cosres;
    result.m1  = y*x*t + z*sinres;
    result.m2  = z*x*t - y*sinres;
    result.m3  = 0.0f;

    result.m4  = x*y*t - z*sinres;
    result.m5  = y*y*t + cosres;
    result.m6  = z*y*t + x*sinres;
    result.m7  = 0.0f;

    result.m8  = x*z*t + y*sinres;
    result.m9  = y*z*t - x*sinres;
    result.m10 = z*z*t + cosres;
    result.m11 = 0.0f;

    result.m12 = 0.0f;
    result.m13 = 0.0f;
    result.m14 = 0.0f;
    result.m15 = 1.0f;

    return result;
}